

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

void ft_recompute_scaled_metrics(FT_Face face,FT_Size_Metrics *metrics)

{
  FT_Long FVar1;
  ulong uVar2;
  FT_Long FVar3;
  
  FVar3 = metrics->y_scale;
  FVar1 = FT_MulFix((long)face->ascender,FVar3);
  metrics->ascender = FVar1 + 0x3fU & 0xffffffffffffffc0;
  uVar2 = FT_MulFix((long)face->descender,FVar3);
  metrics->descender = uVar2 & 0xffffffffffffffc0;
  FVar3 = FT_MulFix((long)face->height,FVar3);
  metrics->height = FVar3 + 0x20U & 0xffffffffffffffc0;
  FVar3 = FT_MulFix((long)face->max_advance_width,metrics->x_scale);
  metrics->max_advance = FVar3 + 0x20U & 0xffffffffffffffc0;
  return;
}

Assistant:

static void
  ft_recompute_scaled_metrics( FT_Face           face,
                               FT_Size_Metrics*  metrics )
  {
    /* Compute root ascender, descender, test height, and max_advance */

#ifdef GRID_FIT_METRICS
    metrics->ascender    = FT_PIX_CEIL( FT_MulFix( face->ascender,
                                                   metrics->y_scale ) );

    metrics->descender   = FT_PIX_FLOOR( FT_MulFix( face->descender,
                                                    metrics->y_scale ) );

    metrics->height      = FT_PIX_ROUND( FT_MulFix( face->height,
                                                    metrics->y_scale ) );

    metrics->max_advance = FT_PIX_ROUND( FT_MulFix( face->max_advance_width,
                                                    metrics->x_scale ) );
#else /* !GRID_FIT_METRICS */
    metrics->ascender    = FT_MulFix( face->ascender,
                                      metrics->y_scale );

    metrics->descender   = FT_MulFix( face->descender,
                                      metrics->y_scale );

    metrics->height      = FT_MulFix( face->height,
                                      metrics->y_scale );

    metrics->max_advance = FT_MulFix( face->max_advance_width,
                                      metrics->x_scale );
#endif /* !GRID_FIT_METRICS */
  }